

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CatalogReader.hpp
# Opt level: O2

CourseComponent * __thiscall CatalogReader::constructCourse(CatalogReader *this,ifstream *fin)

{
  int numUnits;
  ostream *poVar1;
  Course *this_00;
  string *newCourseName;
  string *newCourseDescription;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prereqList;
  string courseName;
  string prerequisites;
  string courseTitle;
  string combined;
  string courseDescription;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  courseName._M_dataplus._M_p = (pointer)&courseName.field_2;
  courseName._M_string_length = 0;
  courseDescription._M_dataplus._M_p = (pointer)&courseDescription.field_2;
  courseDescription._M_string_length = 0;
  courseTitle._M_dataplus._M_p = (pointer)&courseTitle.field_2;
  courseTitle._M_string_length = 0;
  courseName.field_2._M_local_buf[0] = '\0';
  courseDescription.field_2._M_local_buf[0] = '\0';
  prerequisites._M_dataplus._M_p = (pointer)&prerequisites.field_2;
  prerequisites._M_string_length = 0;
  combined._M_dataplus._M_p = (pointer)&combined.field_2;
  combined._M_string_length = 0;
  courseTitle.field_2._M_local_buf[0] = '\0';
  prerequisites.field_2._M_local_buf[0] = '\0';
  combined.field_2._M_local_buf[0] = '\0';
  prereqList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  prereqList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  prereqList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)fin,(string *)&courseName);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)fin,(string *)&courseTitle);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)fin,(string *)&prerequisites);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)fin,(string *)&courseDescription);
  if (this->debugOn == true) {
    poVar1 = std::operator<<((ostream *)&std::cout,"--- FILE TEXT ---");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&courseName);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,(string *)&courseTitle);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,(string *)&prerequisites);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,(string *)&courseDescription);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"-----------------");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::__cxx11::string::string((string *)&local_d0,(string *)&prerequisites);
  getPrereqs((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_f0,this,&local_d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&prereqList,&local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  numUnits = getCourseUnits(this,&courseTitle);
  std::operator+(&local_110,&courseTitle,"\n");
  std::operator+(&local_f0,&local_110,&courseDescription);
  std::__cxx11::string::operator=((string *)&combined,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  if (prereqList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      prereqList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = (Course *)operator_new(0x68);
    newCourseName = &local_50;
    std::__cxx11::string::string((string *)newCourseName,(string *)&courseName);
    newCourseDescription = &local_70;
    std::__cxx11::string::string((string *)newCourseDescription,(string *)&combined);
    Prerequisite::Prerequisite((Prerequisite *)this_00,newCourseName,numUnits,newCourseDescription);
  }
  else {
    this_00 = (Course *)operator_new(0x88);
    std::__cxx11::string::string((string *)&local_90,(string *)&courseName);
    std::__cxx11::string::string((string *)&local_b0,(string *)&combined);
    std::__cxx11::string::string((string *)&local_130,(string *)&prerequisites);
    newCourseName = &local_90;
    newCourseDescription = &local_b0;
    Course::Course(this_00,newCourseName,numUnits,newCourseDescription,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
  }
  std::__cxx11::string::~string((string *)newCourseDescription);
  std::__cxx11::string::~string((string *)newCourseName);
  if (this->debugOn == true) {
    poVar1 = std::operator<<((ostream *)&std::cout,"-- COURSE CREATED --");
    std::endl<char,std::char_traits<char>>(poVar1);
    (*(this_00->super_CourseComponent).super_Observer._vptr_Observer[8])(this_00);
    poVar1 = std::operator<<((ostream *)&std::cout,"--------------------");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)fin,(string *)&courseName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&prereqList);
  std::__cxx11::string::~string((string *)&combined);
  std::__cxx11::string::~string((string *)&prerequisites);
  std::__cxx11::string::~string((string *)&courseTitle);
  std::__cxx11::string::~string((string *)&courseDescription);
  std::__cxx11::string::~string((string *)&courseName);
  return &this_00->super_CourseComponent;
}

Assistant:

CourseComponent* constructCourse(ifstream& fin) const {
			string courseName, courseDescription, courseTitle, prerequisites, combined;
			vector<string> prereqList;
			int units;

			getline(fin, courseName);
			getline(fin, courseTitle);
			getline(fin, prerequisites);
			getline(fin, courseDescription);
			
			if (debugOn) {
				cout << "--- FILE TEXT ---" << endl;
				cout << courseName << endl << courseTitle << endl << prerequisites << endl << courseDescription << endl;
				cout << "-----------------" << endl;
			}

			prereqList = getPrereqs(prerequisites);
			units = getCourseUnits(courseTitle);

			combined = courseTitle + "\n" + courseDescription;

			CourseComponent* course;
			if (prereqList.size() == 0) {
				course = new Prerequisite(courseName, units, combined);
			} else {
				course = new Course(courseName, units, combined, prerequisites);
			}

			if (debugOn) {
				cout << "-- COURSE CREATED --" << endl;
				course->displayCourseInfo();
				cout << "--------------------" << endl;
			}

			getline(fin, courseName); // one more time so the it skips the empty space

			return course;
		}